

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O2

void __thiscall helics::EndpointInfo::removeTarget(EndpointInfo *this,GlobalHandle targetId)

{
  pointer ppVar1;
  pointer pEVar2;
  EndpointInformation *pEVar3;
  long lVar4;
  long lVar5;
  const_iterator cVar6;
  EndpointInformation *pEVar7;
  EndpointInformation *pEVar8;
  const_iterator cVar9;
  InterfaceHandle IVar10;
  EndpointInformation *targetInfo;
  pointer __args;
  GlobalFederateId GVar11;
  
  cVar6._M_current =
       (this->targetInformation).
       super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
       ._M_impl.super__Vector_impl_data._M_start;
  cVar9._M_current =
       (this->targetInformation).
       super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  GVar11 = targetId.fed_id.gid;
  IVar10 = targetId.handle.hid;
  if (cVar6._M_current != cVar9._M_current) {
    lVar5 = (long)cVar9._M_current - (long)cVar6._M_current;
    for (lVar4 = lVar5 / 0x48 >> 2; 0 < lVar4; lVar4 = lVar4 + -1) {
      if ((((cVar6._M_current)->id).fed_id.gid == GVar11.gid) &&
         (((cVar6._M_current)->id).handle.hid == IVar10.hid)) goto LAB_002ba904;
      if ((cVar6._M_current[1].id.fed_id.gid == GVar11.gid) &&
         (cVar6._M_current[1].id.handle.hid == IVar10.hid)) {
        cVar6._M_current = cVar6._M_current + 1;
        goto LAB_002ba904;
      }
      if ((cVar6._M_current[2].id.fed_id.gid == GVar11.gid) &&
         (cVar6._M_current[2].id.handle.hid == IVar10.hid)) {
        cVar6._M_current = cVar6._M_current + 2;
        goto LAB_002ba904;
      }
      if ((cVar6._M_current[3].id.fed_id.gid == GVar11.gid) &&
         (cVar6._M_current[3].id.handle.hid == IVar10.hid)) {
        cVar6._M_current = cVar6._M_current + 3;
        goto LAB_002ba904;
      }
      cVar6._M_current = cVar6._M_current + 4;
      lVar5 = lVar5 + -0x120;
    }
    lVar5 = lVar5 / 0x48;
    if (lVar5 == 1) {
LAB_002ba8db:
      if (((cVar6._M_current)->id).handle.hid != IVar10.hid ||
          ((cVar6._M_current)->id).fed_id.gid != GVar11.gid) {
        cVar6._M_current = cVar9._M_current;
      }
    }
    else if (lVar5 == 2) {
LAB_002ba8cc:
      if ((((cVar6._M_current)->id).fed_id.gid != GVar11.gid) ||
         (((cVar6._M_current)->id).handle.hid != IVar10.hid)) {
        cVar6._M_current = cVar6._M_current + 1;
        goto LAB_002ba8db;
      }
    }
    else {
      if (lVar5 != 3) goto LAB_002ba9b8;
      if ((((cVar6._M_current)->id).fed_id.gid != GVar11.gid) ||
         (((cVar6._M_current)->id).handle.hid != IVar10.hid)) {
        cVar6._M_current = cVar6._M_current + 1;
        goto LAB_002ba8cc;
      }
    }
LAB_002ba904:
    pEVar8 = cVar6._M_current;
    if (cVar6._M_current != cVar9._M_current) {
      while (pEVar7 = pEVar8 + 1, pEVar7 != cVar9._M_current) {
        if (((pEVar7->id).fed_id.gid != GVar11.gid) ||
           (pEVar3 = pEVar8 + 1, pEVar8 = pEVar7, (pEVar3->id).handle.hid != IVar10.hid)) {
          EndpointInformation::operator=(cVar6._M_current,pEVar7);
          cVar6._M_current = cVar6._M_current + 1;
          pEVar8 = pEVar7;
        }
      }
      cVar9._M_current =
           (this->targetInformation).
           super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
    if (cVar6._M_current != cVar9._M_current) {
      std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::erase
                (&this->targetInformation,cVar6,cVar9);
      ppVar1 = (this->targets).
               super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->targets).
          super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppVar1) {
        (this->targets).
        super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppVar1;
      }
      pEVar2 = (this->targetInformation).
               super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__args = (this->targetInformation).
                    super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                    ._M_impl.super__Vector_impl_data._M_start; __args != pEVar2; __args = __args + 1
          ) {
        std::
        vector<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>>>
        ::emplace_back<helics::GlobalHandle_const&,std::__cxx11::string_const&>
                  ((vector<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>>>
                    *)&this->targets,&__args->id,&__args->key);
      }
    }
  }
LAB_002ba9b8:
  pEVar8 = (this->sourceInformation).
           super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  cVar6._M_current =
       (this->sourceInformation).
       super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar8 == cVar6._M_current) {
    return;
  }
  lVar5 = (long)cVar6._M_current - (long)pEVar8;
  for (lVar4 = lVar5 / 0x48 >> 2; 0 < lVar4; lVar4 = lVar4 + -1) {
    if (((pEVar8->id).fed_id.gid == GVar11.gid) &&
       (cVar9._M_current = pEVar8, (pEVar8->id).handle.hid == IVar10.hid)) goto LAB_002baace;
    if ((pEVar8[1].id.fed_id.gid == GVar11.gid) && (pEVar8[1].id.handle.hid == IVar10.hid)) {
      cVar9._M_current = pEVar8 + 1;
      goto LAB_002baace;
    }
    if ((pEVar8[2].id.fed_id.gid == GVar11.gid) && (pEVar8[2].id.handle.hid == IVar10.hid)) {
      cVar9._M_current = pEVar8 + 2;
      goto LAB_002baace;
    }
    if ((pEVar8[3].id.fed_id.gid == GVar11.gid) && (pEVar8[3].id.handle.hid == IVar10.hid)) {
      cVar9._M_current = pEVar8 + 3;
      goto LAB_002baace;
    }
    pEVar8 = pEVar8 + 4;
    lVar5 = lVar5 + -0x120;
  }
  lVar5 = lVar5 / 0x48;
  if (lVar5 == 1) {
LAB_002baaa5:
    cVar9._M_current = pEVar8;
    if ((pEVar8->id).handle.hid != IVar10.hid || (pEVar8->id).fed_id.gid != GVar11.gid) {
      cVar9._M_current = cVar6._M_current;
    }
  }
  else if (lVar5 == 2) {
LAB_002baa96:
    if (((pEVar8->id).fed_id.gid != GVar11.gid) ||
       (cVar9._M_current = pEVar8, (pEVar8->id).handle.hid != IVar10.hid)) {
      pEVar8 = pEVar8 + 1;
      goto LAB_002baaa5;
    }
  }
  else {
    cVar9._M_current = cVar6._M_current;
    if (lVar5 != 3) goto LAB_002bab19;
    if (((pEVar8->id).fed_id.gid != GVar11.gid) ||
       (cVar9._M_current = pEVar8, (pEVar8->id).handle.hid != IVar10.hid)) {
      pEVar8 = pEVar8 + 1;
      goto LAB_002baa96;
    }
  }
LAB_002baace:
  pEVar8 = cVar9._M_current;
  if (cVar9._M_current != cVar6._M_current) {
    while (pEVar7 = cVar9._M_current + 1, pEVar7 != cVar6._M_current) {
      if (((pEVar7->id).fed_id.gid != GVar11.gid) ||
         (pEVar3 = cVar9._M_current + 1, cVar9._M_current = pEVar7,
         (pEVar3->id).handle.hid != IVar10.hid)) {
        EndpointInformation::operator=(pEVar8,pEVar7);
        cVar9._M_current = pEVar7;
        pEVar8 = pEVar8 + 1;
      }
    }
    cVar6._M_current =
         (this->sourceInformation).
         super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    cVar9._M_current = pEVar8;
  }
LAB_002bab19:
  std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::erase
            (&this->sourceInformation,cVar9,cVar6);
  return;
}

Assistant:

void EndpointInfo::removeTarget(GlobalHandle targetId)
{
    if (!targetInformation.empty()) {
        auto removeIterator = std::remove_if(targetInformation.begin(),
                                             targetInformation.end(),
                                             [targetId](const auto& targetInfo) {
                                                 return targetInfo.id == targetId;
                                             });
        if (removeIterator != targetInformation.end()) {
            targetInformation.erase(removeIterator, targetInformation.end());
            targets.clear();
            for (const auto& targetInfo : targetInformation) {
                targets.emplace_back(targetInfo.id, targetInfo.key);
            }
        }
    }
    if (!sourceInformation.empty()) {
        auto removeIterator =
            std::remove_if(sourceInformation.begin(),
                           sourceInformation.end(),
                           [targetId](const auto& sinfo) { return sinfo.id == targetId; });
        sourceInformation.erase(removeIterator, sourceInformation.end());
    }
}